

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_load_standard_env(sexp ctx,sexp e,sexp version)

{
  sexp psVar1;
  sexp psVar2;
  sexp tmp;
  sexp sym;
  sexp op;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver3;
  sexp_gc_var_t __sexp_gc_preserver2;
  char init_file [128];
  sexp local_f0;
  sexp local_e8;
  sexp local_e0;
  sexp_gc_var_t local_d8;
  sexp_gc_var_t local_c8;
  sexp_gc_var_t local_b8;
  char local_a8 [5];
  char cStack_a3;
  undefined4 local_a2;
  undefined1 local_9e;
  
  local_d8.var = &local_e0;
  local_e0 = (sexp)0x43e;
  local_b8.next = &local_d8;
  local_b8.var = &local_f0;
  local_f0 = (sexp)0x43e;
  local_c8.next = &local_b8;
  local_c8.var = &local_e8;
  local_e8 = (sexp)0x43e;
  local_d8.next = (ctx->value).context.saves;
  (ctx->value).context.saves = local_b8.next;
  (ctx->value).context.saves = local_c8.next;
  (ctx->value).context.saves = &local_c8;
  if (e == (sexp)0x0) {
    e = (ctx->value).type.cpl;
  }
  psVar1 = sexp_intern(ctx,"*shared-object-extension*",-1);
  local_e8 = psVar1;
  local_f0 = sexp_c_string(ctx,".so",-1);
  sexp_env_define(ctx,e,psVar1,local_f0);
  local_e8 = sexp_intern(ctx,"*features*",-1);
  sexp_env_define(ctx,e,local_e8,(((ctx->value).type.setters)->value).type.setters);
  (((ctx->value).type.setters)->value).opcode.dl = (sexp)0x23e;
  local_e0 = sexp_make_foreign(ctx,"sexp_simplify",1,0,(char *)0x0,sexp_simplify,(sexp)&DAT_0000043e
                              );
  local_f0 = sexp_cons_op(ctx,(sexp)0x0,2,(sexp)&DAT_000003e9,local_e0);
  sexp_push_op(ctx,&(((ctx->value).type.setters)->value).opcode.dl,local_f0);
  local_e8 = sexp_intern(ctx,"current-exception-handler",-1);
  psVar1 = sexp_env_cell_loc(ctx,e,local_e8,0,(sexp_conflict *)0x0);
  if (psVar1 == (sexp)0x0) {
    psVar1 = (sexp)0x3e;
  }
  else {
    psVar1 = (psVar1->value).type.cpl;
  }
  (((ctx->value).type.setters)->value).context.mark_stack[4].prev = (sexp_mark_stack_ptr_t *)psVar1;
  builtin_strncpy(local_a8,"init",4);
  stack0xffffffffffffff5c = CONCAT11((char)((ulong)version >> 1) + '0',0x2d);
  local_a2 = 0x6d63732e;
  local_9e = 0;
  local_f0 = sexp_load_module_file(ctx,local_a8,e);
  sexp_set_parameter(ctx,e,(sexp)(((ctx->value).type.setters)->value).context.mark_stack[4].start,e)
  ;
  if ((((ulong)local_f0 & 3) != 0) || (local_f0->tag != 0x13)) {
    local_f0 = (((ctx->value).type.setters)->value).context.dl;
    if ((((ulong)local_f0 & 3) != 0) || (local_f0->tag != 0x17)) {
      local_f0 = sexp_alloc_tagged_aux(ctx,0x28,0x17);
      (local_f0->value).flonum = 0.0;
      (local_f0->value).type.cpl = (sexp)0x0;
      (local_f0->value).uvector.length = 0x23e;
      (local_f0->value).bytecode.length = 0x23e;
      if ((((ulong)local_f0 & 3) != 0) || (local_f0->tag != 0x13)) {
        (((ctx->value).type.setters)->value).context.dl = local_f0;
        (local_f0->value).type.name = e;
        psVar1 = sexp_load_module_file(ctx,"meta-7.scm",local_f0);
        local_e0 = psVar1;
        if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x13)) {
          psVar2 = sexp_env_cell_loc(ctx,(ctx->value).type.cpl,
                                     (sexp)(((ctx->value).type.setters)->value).context.mark_stack
                                           [3].prev,0,(sexp_conflict *)0x0);
          if (psVar2 == (sexp)0x0) {
            psVar2 = (sexp)&DAT_0000003e;
          }
          else {
            psVar2 = (psVar2->value).type.cpl;
          }
          psVar2 = sexp_parameter_ref(ctx,psVar2);
          sexp_print_exception_op(ctx,(sexp)0x0,2,psVar1,psVar2);
        }
      }
    }
    if ((((ulong)local_f0 & 3) != 0) || (local_f0->tag != 0x13)) {
      local_e8 = sexp_intern(ctx,"repl-import",-1);
      psVar1 = sexp_env_cell_loc(ctx,local_f0,local_e8,0,(sexp_conflict *)0x0);
      if (psVar1 == (sexp)0x0) {
        local_f0 = (sexp)&DAT_0000043e;
      }
      else {
        local_f0 = (psVar1->value).type.cpl;
      }
      local_e8 = sexp_intern(ctx,"import",-1);
      local_f0 = sexp_cons_op(ctx,(sexp)0x0,2,local_e8,local_f0);
      (local_f0->value).type.slots = (((e->value).type.slots)->value).type.slots;
      (((e->value).type.slots)->value).type.slots = local_f0;
    }
  }
  (ctx->value).context.saves = local_d8.next;
  if ((((ulong)local_f0 & 3) != 0) || (local_f0->tag != 0x13)) {
    local_f0 = e;
  }
  return local_f0;
}

Assistant:

sexp sexp_load_standard_env (sexp ctx, sexp e, sexp version) {
  int len;
  char init_file[128];
  sexp_gc_var3(op, tmp, sym);
  sexp_gc_preserve3(ctx, op, tmp, sym);
  if (!e) e = sexp_context_env(ctx);
  sexp_env_define(ctx, e, sym=sexp_intern(ctx, "*shared-object-extension*", -1),
                  tmp=sexp_c_string(ctx, sexp_so_extension, -1));
  sexp_env_define(ctx, e, sym=sexp_intern(ctx, "*features*", -1), sexp_global(ctx, SEXP_G_FEATURES));
  sexp_global(ctx, SEXP_G_OPTIMIZATIONS) = SEXP_NULL;
#if SEXP_USE_SIMPLIFY
  op = sexp_make_foreign(ctx, "sexp_simplify", 1, 0,
                         NULL, (sexp_proc1)sexp_simplify, SEXP_VOID);
  tmp = sexp_cons(ctx, sexp_make_fixnum(500), op);
  sexp_push(ctx, sexp_global(ctx, SEXP_G_OPTIMIZATIONS), tmp);
#endif
  sexp_global(ctx, SEXP_G_ERR_HANDLER)
    = sexp_env_ref(ctx, e, sym=sexp_intern(ctx, "current-exception-handler", -1), SEXP_FALSE);
  /* load init-7.scm */
  len = strlen(sexp_init_file);
  strncpy(init_file, sexp_init_file, len+1);
  init_file[len] = (char)sexp_unbox_fixnum(version) + '0';
  strncpy(init_file + len + 1, sexp_init_file_suffix, strlen(sexp_init_file_suffix)+1);
  init_file[len + 1 + strlen(sexp_init_file_suffix)] = 0;
  tmp = sexp_load_module_file(ctx, init_file, e);
  sexp_set_parameter(ctx, e, sexp_global(ctx, SEXP_G_INTERACTION_ENV_SYMBOL), e);
  /* load and bind meta-7.scm env */
#if SEXP_USE_MODULES
  if (!sexp_exceptionp(tmp)) {
    if (!sexp_envp(tmp=sexp_global(ctx, SEXP_G_META_ENV))) {
      tmp = sexp_make_env(ctx);
      if (! sexp_exceptionp(tmp)) {
        sexp_global(ctx, SEXP_G_META_ENV) = tmp;
        sexp_env_parent(tmp) = e;
        op = sexp_load_module_file(ctx, sexp_meta_file, tmp);
        if (sexp_exceptionp(op))
          sexp_print_exception(ctx, op, sexp_current_error_port(ctx));
      }
    }
    if (!sexp_exceptionp(tmp)) {
      sym = sexp_intern(ctx, "repl-import", -1);
      tmp = sexp_env_ref(ctx, tmp, sym, SEXP_VOID);
      sym = sexp_intern(ctx, "import", -1);
      /* splice import in place to mutate both this env and the */
      /* frozen version in the meta env) */
      tmp = sexp_cons(ctx, sym, tmp);
      sexp_env_next_cell(tmp) = sexp_env_next_cell(sexp_env_bindings(e));
      sexp_env_next_cell(sexp_env_bindings(e)) = tmp;
    }
  }
#endif
  sexp_gc_release3(ctx);
  return sexp_exceptionp(tmp) ? tmp : e;
}